

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfRgbaFile.cpp
# Opt level: O2

void __thiscall Imf_3_4::RgbaInputFile::setLayerName(RgbaInputFile *this,string *layerName)

{
  RgbaChannels rgbaChannels;
  Header *header;
  FromYca *pFVar1;
  FrameBuffer fb;
  undefined1 local_50 [32];
  _Base_ptr local_30;
  size_t local_28;
  
  pFVar1 = this->_fromYca;
  if (pFVar1 != (FromYca *)0x0) {
    FromYca::~FromYca(pFVar1);
  }
  operator_delete(pFVar1,0x188);
  this->_fromYca = (FromYca *)0x0;
  header = InputPart::header(this->_inputPart);
  anon_unknown_1::prefixFromLayerName((string *)local_50,layerName,header);
  std::__cxx11::string::operator=((string *)&this->_channelNamePrefix,(string *)local_50);
  std::__cxx11::string::~string((string *)local_50);
  rgbaChannels = channels(this);
  if ((WRITE_YA|WRITE_RGB) < rgbaChannels) {
    pFVar1 = (FromYca *)operator_new(0x188);
    FromYca::FromYca(pFVar1,this->_inputPart,rgbaChannels);
    this->_fromYca = pFVar1;
  }
  local_50._24_8_ = local_50 + 8;
  local_50._8_4_ = _S_red;
  local_50._16_8_ = 0;
  local_28 = 0;
  local_30 = (_Base_ptr)local_50._24_8_;
  InputPart::setFrameBuffer(this->_inputPart,(FrameBuffer *)local_50);
  std::
  _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
  ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
               *)local_50);
  return;
}

Assistant:

void
RgbaInputFile::setLayerName (const string& layerName)
{
    delete _fromYca;
    _fromYca = nullptr;

    _channelNamePrefix = prefixFromLayerName (layerName, _inputPart->header ());

    RgbaChannels rgbaChannels = channels ();

    if (rgbaChannels & WRITE_C)
        _fromYca = new FromYca (*_inputPart, rgbaChannels);

    FrameBuffer fb;
    _inputPart->setFrameBuffer (fb);
}